

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprParse(ParseContext *pParse,char *z,int n,Fts3Expr **ppExpr,int *pnConsumed)

{
  int iVar1;
  Fts3Expr *pFVar2;
  bool local_91;
  Fts3Expr *local_90;
  Fts3Expr *pIter;
  Fts3Expr *pAnd;
  int eType;
  Fts3Expr *pNot;
  int isPhrase;
  int nByte;
  Fts3Expr *p;
  int isRequirePhrase;
  int rc;
  char *zIn;
  Fts3Expr *pFStack_48;
  int nIn;
  Fts3Expr *pNotBranch;
  Fts3Expr *pPrev;
  Fts3Expr *pRet;
  int *pnConsumed_local;
  Fts3Expr **ppExpr_local;
  char *pcStack_18;
  int n_local;
  char *z_local;
  ParseContext *pParse_local;
  
  pPrev = (Fts3Expr *)0x0;
  pNotBranch = (Fts3Expr *)0x0;
  pFStack_48 = (Fts3Expr *)0x0;
  p._4_4_ = 0;
  p._0_4_ = 1;
  _isRequirePhrase = z;
  zIn._4_4_ = n;
  pRet = (Fts3Expr *)pnConsumed;
  pnConsumed_local = (int *)ppExpr;
  ppExpr_local._4_4_ = n;
  pcStack_18 = z;
  z_local = (char *)pParse;
  do {
    if (p._4_4_ != 0) {
      if (((p._4_4_ == 0x65) && (pPrev != (Fts3Expr *)0x0)) && ((uint)p != 0)) {
        p._4_4_ = 1;
      }
      if ((p._4_4_ == 0x65) && (p._4_4_ = 0, pFStack_48 != (Fts3Expr *)0x0)) {
        if (pPrev == (Fts3Expr *)0x0) {
          p._4_4_ = 1;
        }
        else {
          for (local_90 = pFStack_48; local_90->pLeft != (Fts3Expr *)0x0; local_90 = local_90->pLeft
              ) {
          }
          local_90->pLeft = pPrev;
          pPrev->pParent = local_90;
          pPrev = pFStack_48;
        }
      }
      pRet->eType = ppExpr_local._4_4_ - zIn._4_4_;
LAB_001fe53c:
      if (p._4_4_ != 0) {
        sqlite3Fts3ExprFree(pPrev);
        sqlite3Fts3ExprFree(pFStack_48);
        pPrev = (Fts3Expr *)0x0;
      }
      *(Fts3Expr **)pnConsumed_local = pPrev;
      return p._4_4_;
    }
    _isPhrase = (Fts3Expr *)0x0;
    pNot._4_4_ = 0;
    p._4_4_ = getNextNode((ParseContext *)z_local,_isRequirePhrase,zIn._4_4_,(Fts3Expr **)&isPhrase,
                          (int *)((long)&pNot + 4));
    if ((p._4_4_ == 0) && (_isPhrase != (Fts3Expr *)0x0)) {
      if ((_isPhrase->eType == 5) && (*(int *)(z_local + 0x24) != 0)) {
        pFVar2 = (Fts3Expr *)fts3MallocZero(0x40);
        if (pFVar2 == (Fts3Expr *)0x0) {
          sqlite3Fts3ExprFree(_isPhrase);
          p._4_4_ = 7;
          goto LAB_001fe53c;
        }
        pFVar2->eType = 2;
        pFVar2->pRight = _isPhrase;
        _isPhrase->pParent = pFVar2;
        if (pFStack_48 != (Fts3Expr *)0x0) {
          pFVar2->pLeft = pFStack_48;
          pFStack_48->pParent = pFVar2;
        }
        _isPhrase = pNotBranch;
        pFStack_48 = pFVar2;
      }
      else {
        iVar1 = _isPhrase->eType;
        local_91 = true;
        if (iVar1 != 5) {
          local_91 = _isPhrase->pLeft != (Fts3Expr *)0x0;
        }
        pNot._0_4_ = (uint)local_91;
        if (((uint)pNot == 0) && ((uint)p != 0)) {
          sqlite3Fts3ExprFree(_isPhrase);
          p._4_4_ = 1;
          goto LAB_001fe53c;
        }
        if (((uint)pNot != 0) && ((uint)p == 0)) {
          pFVar2 = (Fts3Expr *)fts3MallocZero(0x40);
          if (pFVar2 == (Fts3Expr *)0x0) {
            sqlite3Fts3ExprFree(_isPhrase);
            p._4_4_ = 7;
            goto LAB_001fe53c;
          }
          pFVar2->eType = 3;
          insertBinaryOperator(&pPrev,pNotBranch,pFVar2);
          pNotBranch = pFVar2;
        }
        if ((pNotBranch != (Fts3Expr *)0x0) &&
           ((((iVar1 == 1 && ((uint)pNot == 0)) && (pNotBranch->eType != 5)) ||
            (((iVar1 != 5 && ((uint)pNot != 0)) && (pNotBranch->eType == 1)))))) {
          sqlite3Fts3ExprFree(_isPhrase);
          p._4_4_ = 1;
          goto LAB_001fe53c;
        }
        if ((uint)pNot == 0) {
          insertBinaryOperator(&pPrev,pNotBranch,_isPhrase);
        }
        else if (pPrev == (Fts3Expr *)0x0) {
          pPrev = _isPhrase;
        }
        else {
          pNotBranch->pRight = _isPhrase;
          _isPhrase->pParent = pNotBranch;
        }
        p._0_4_ = (uint)(((uint)pNot != 0 ^ 0xffU) & 1);
      }
      pNotBranch = _isPhrase;
    }
    zIn._4_4_ = zIn._4_4_ - pNot._4_4_;
    _isRequirePhrase = _isRequirePhrase + pNot._4_4_;
  } while( true );
}

Assistant:

static int fts3ExprParse(
  ParseContext *pParse,                   /* fts3 query parse context */
  const char *z, int n,                   /* Text of MATCH query */
  Fts3Expr **ppExpr,                      /* OUT: Parsed query structure */
  int *pnConsumed                         /* OUT: Number of bytes consumed */
){
  Fts3Expr *pRet = 0;
  Fts3Expr *pPrev = 0;
  Fts3Expr *pNotBranch = 0;               /* Only used in legacy parse mode */
  int nIn = n;
  const char *zIn = z;
  int rc = SQLITE_OK;
  int isRequirePhrase = 1;

  while( rc==SQLITE_OK ){
    Fts3Expr *p = 0;
    int nByte = 0;

    rc = getNextNode(pParse, zIn, nIn, &p, &nByte);
    assert( nByte>0 || (rc!=SQLITE_OK && p==0) );
    if( rc==SQLITE_OK ){
      if( p ){
        int isPhrase;

        if( !sqlite3_fts3_enable_parentheses 
            && p->eType==FTSQUERY_PHRASE && pParse->isNot 
        ){
          /* Create an implicit NOT operator. */
          Fts3Expr *pNot = fts3MallocZero(sizeof(Fts3Expr));
          if( !pNot ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_NOMEM;
            goto exprparse_out;
          }
          pNot->eType = FTSQUERY_NOT;
          pNot->pRight = p;
          p->pParent = pNot;
          if( pNotBranch ){
            pNot->pLeft = pNotBranch;
            pNotBranch->pParent = pNot;
          }
          pNotBranch = pNot;
          p = pPrev;
        }else{
          int eType = p->eType;
          isPhrase = (eType==FTSQUERY_PHRASE || p->pLeft);

          /* The isRequirePhrase variable is set to true if a phrase or
          ** an expression contained in parenthesis is required. If a
          ** binary operator (AND, OR, NOT or NEAR) is encounted when
          ** isRequirePhrase is set, this is a syntax error.
          */
          if( !isPhrase && isRequirePhrase ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_ERROR;
            goto exprparse_out;
          }

          if( isPhrase && !isRequirePhrase ){
            /* Insert an implicit AND operator. */
            Fts3Expr *pAnd;
            assert( pRet && pPrev );
            pAnd = fts3MallocZero(sizeof(Fts3Expr));
            if( !pAnd ){
              sqlite3Fts3ExprFree(p);
              rc = SQLITE_NOMEM;
              goto exprparse_out;
            }
            pAnd->eType = FTSQUERY_AND;
            insertBinaryOperator(&pRet, pPrev, pAnd);
            pPrev = pAnd;
          }

          /* This test catches attempts to make either operand of a NEAR
           ** operator something other than a phrase. For example, either of
           ** the following:
           **
           **    (bracketed expression) NEAR phrase
           **    phrase NEAR (bracketed expression)
           **
           ** Return an error in either case.
           */
          if( pPrev && (
            (eType==FTSQUERY_NEAR && !isPhrase && pPrev->eType!=FTSQUERY_PHRASE)
         || (eType!=FTSQUERY_PHRASE && isPhrase && pPrev->eType==FTSQUERY_NEAR)
          )){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_ERROR;
            goto exprparse_out;
          }

          if( isPhrase ){
            if( pRet ){
              assert( pPrev && pPrev->pLeft && pPrev->pRight==0 );
              pPrev->pRight = p;
              p->pParent = pPrev;
            }else{
              pRet = p;
            }
          }else{
            insertBinaryOperator(&pRet, pPrev, p);
          }
          isRequirePhrase = !isPhrase;
        }
        pPrev = p;
      }
      assert( nByte>0 );
    }
    assert( rc!=SQLITE_OK || (nByte>0 && nByte<=nIn) );
    nIn -= nByte;
    zIn += nByte;
  }

  if( rc==SQLITE_DONE && pRet && isRequirePhrase ){
    rc = SQLITE_ERROR;
  }

  if( rc==SQLITE_DONE ){
    rc = SQLITE_OK;
    if( !sqlite3_fts3_enable_parentheses && pNotBranch ){
      if( !pRet ){
        rc = SQLITE_ERROR;
      }else{
        Fts3Expr *pIter = pNotBranch;
        while( pIter->pLeft ){
          pIter = pIter->pLeft;
        }
        pIter->pLeft = pRet;
        pRet->pParent = pIter;
        pRet = pNotBranch;
      }
    }
  }
  *pnConsumed = n - nIn;

exprparse_out:
  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(pRet);
    sqlite3Fts3ExprFree(pNotBranch);
    pRet = 0;
  }
  *ppExpr = pRet;
  return rc;
}